

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom.cpp
# Opt level: O0

void __thiscall md::ROM::ROM(ROM *this,string *input_path)

{
  byte bVar1;
  reference pvVar2;
  char local_230 [8];
  ifstream file;
  string *input_path_local;
  ROM *this_local;
  
  this->_was_open = false;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->_byte_array);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->_original_byte_array);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map(&this->_stored_addresses);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&this->_empty_chunks);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->_byte_array,0x200000);
  std::ifstream::ifstream(local_230,(string *)input_path,_S_bin);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->_byte_array,0);
    std::istream::read(local_230,(long)pvVar2);
    std::ifstream::close();
    this->_was_open = true;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->_original_byte_array,&this->_byte_array);
  std::ifstream::~ifstream(local_230);
  return;
}

Assistant:

ROM::ROM(const std::string& input_path) : _was_open(false)
{
    _byte_array.resize(0x200000);
    std::ifstream file(input_path, std::ios::binary);
    if (file.is_open())
    {
        file.read((char*)&(_byte_array[0]), 0x200000);
        file.close();
        _was_open = true;
    }

    // Keep an original copy of the ROM contents to check for double overwrites
    _original_byte_array = _byte_array;
}